

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Endpoints.cpp
# Opt level: O0

bool soul::isMIDIEventEndpoint(EndpointDetails *details)

{
  bool bVar1;
  size_t sVar2;
  Type *type;
  byte local_11;
  EndpointDetails *details_local;
  
  bVar1 = isEvent<soul::EndpointDetails>(details);
  local_11 = 0;
  if (bVar1) {
    sVar2 = ArrayWithPreallocation<choc::value::Type,_2UL>::size(&details->dataTypes);
    local_11 = 0;
    if (sVar2 == 1) {
      type = ArrayWithPreallocation<choc::value::Type,_2UL>::front(&details->dataTypes);
      bVar1 = isMIDIMessageStruct(type);
      local_11 = 0;
      if (bVar1) {
        bVar1 = isConsoleEndpoint(&details->name);
        local_11 = bVar1 ^ 0xff;
      }
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool isMIDIEventEndpoint (const EndpointDetails& details)
{
    return isEvent (details)
            && details.dataTypes.size() == 1
            && isMIDIMessageStruct (details.dataTypes.front())
            && ! isConsoleEndpoint (details.name);
}